

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_butterfly_16(ogg_int32_t *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ogg_int32_t oVar5;
  ogg_int32_t r1;
  ogg_int32_t r0;
  ogg_int32_t *x_local;
  
  iVar1 = *x;
  iVar2 = x[8];
  x[8] = *x + x[8];
  iVar3 = x[1];
  iVar4 = x[9];
  x[9] = x[1] + x[9];
  oVar5 = MULT31((iVar1 - iVar2) + (iVar3 - iVar4),0x5a82799a);
  *x = oVar5;
  oVar5 = MULT31((iVar3 - iVar4) - (iVar1 - iVar2),0x5a82799a);
  x[1] = oVar5;
  iVar1 = x[10];
  iVar2 = x[2];
  x[10] = x[2] + x[10];
  iVar3 = x[0xb];
  x[0xb] = x[3] + x[0xb];
  x[2] = x[3] - iVar3;
  x[3] = iVar1 - iVar2;
  iVar1 = x[0xc];
  iVar2 = x[4];
  x[0xc] = x[4] + x[0xc];
  iVar3 = x[0xd];
  iVar4 = x[5];
  x[0xd] = x[5] + x[0xd];
  oVar5 = MULT31((iVar1 - iVar2) - (iVar3 - iVar4),0x5a82799a);
  x[4] = oVar5;
  oVar5 = MULT31((iVar1 - iVar2) + (iVar3 - iVar4),0x5a82799a);
  x[5] = oVar5;
  iVar1 = x[0xe];
  x[0xe] = x[6] + x[0xe];
  iVar2 = x[0xf];
  x[0xf] = x[7] + x[0xf];
  x[6] = iVar1 - x[6];
  x[7] = iVar2 - x[7];
  mdct_butterfly_8(x);
  mdct_butterfly_8(x + 8);
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){

  REG_TYPE r0, r1;

	   r0 = x[ 0] - x[ 8]; x[ 8] += x[ 0];
	   r1 = x[ 1] - x[ 9]; x[ 9] += x[ 1];
	   x[ 0] = MULT31((r0 + r1) , cPI2_8);
	   x[ 1] = MULT31((r1 - r0) , cPI2_8);
	   MB();

	   r0 = x[10] - x[ 2]; x[10] += x[ 2];
	   r1 = x[ 3] - x[11]; x[11] += x[ 3];
	   x[ 2] = r1; x[ 3] = r0;
	   MB();

	   r0 = x[12] - x[ 4]; x[12] += x[ 4];
	   r1 = x[13] - x[ 5]; x[13] += x[ 5];
	   x[ 4] = MULT31((r0 - r1) , cPI2_8);
	   x[ 5] = MULT31((r0 + r1) , cPI2_8);
	   MB();

	   r0 = x[14] - x[ 6]; x[14] += x[ 6];
	   r1 = x[15] - x[ 7]; x[15] += x[ 7];
	   x[ 6] = r0; x[ 7] = r1;
	   MB();

	   mdct_butterfly_8(x);
	   mdct_butterfly_8(x+8);
}